

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O2

void __thiscall Atari2600::TIASound::set_divider(TIASound *this,int channel,uint8_t divider)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_pod_data[0xc] = divider;
  local_28._8_4_ = channel;
  local_28._13_3_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/2600/TIASound.cpp:27:23)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/2600/TIASound.cpp:27:23)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  Concurrency::AsyncTaskQueue<false,_true,_void>::enqueue
            (this->audio_queue_,(function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void Atari2600::TIASound::set_divider(int channel, uint8_t divider) {
	audio_queue_.enqueue([this, channel, divider]() {
		divider_[channel] = divider & 0x1f;
		divider_counter_[channel] = 0;
	});
}